

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_sprintf(STRING_HANDLE handle,char *format,...)

{
  char in_AL;
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  LOGGER_LOG local_160;
  long local_158;
  ulong local_150;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  LOGGER_LOG local_98;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t realloc_size;
  size_t s1Length;
  char *temp;
  STRING *s1;
  LOGGER_LOG l_1;
  undefined4 local_58;
  int s2Length;
  va_list arg_list;
  LOGGER_LOG l;
  char *buf;
  size_t maxBufSize;
  int result;
  char *format_local;
  STRING_HANDLE handle_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_138 = in_RDX;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  if ((handle == (STRING_HANDLE)0x0) || (format == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
                ,"STRING_sprintf",0x240,1,"Invalid arg (NULL)");
    }
    maxBufSize._4_4_ = 0x241;
  }
  else {
    arg_list[0].overflow_arg_area = local_148;
    arg_list[0]._0_8_ = &stack0x00000008;
    s2Length = 0x30;
    local_58 = 0x10;
    l_1._4_4_ = vsnprintf((char *)0x0,0,format,&local_58);
    if (l_1._4_4_ < 0) {
      s1 = (STRING *)xlogging_get_log_function();
      if (s1 != (STRING *)0x0) {
        (*(code *)s1)(0,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
                      ,"STRING_sprintf",0x24e,1,"Failure vsnprintf return < 0");
      }
      maxBufSize._4_4_ = 0x24f;
    }
    else if (l_1._4_4_ == 0) {
      maxBufSize._4_4_ = 0;
    }
    else {
      temp = (char *)handle;
      realloc_size = strlen(handle->s);
      if (realloc_size < -(long)l_1._4_4_ - 1U) {
        local_150 = realloc_size + (long)l_1._4_4_;
      }
      else {
        local_150 = 0xffffffffffffffff;
      }
      if (local_150 < 0xfffffffffffffffe) {
        if (realloc_size < -(long)l_1._4_4_ - 1U) {
          local_158 = realloc_size + (long)l_1._4_4_;
        }
        else {
          local_158 = -1;
        }
        local_160 = (LOGGER_LOG)(local_158 + 1);
      }
      else {
        local_160 = (LOGGER_LOG)0xffffffffffffffff;
      }
      l_2 = local_160;
      if ((local_160 == (LOGGER_LOG)0xffffffffffffffff) ||
         (s1Length = (size_t)realloc(*(void **)temp,(size_t)local_160),
         (void *)s1Length == (void *)0x0)) {
        local_98 = xlogging_get_log_function();
        if (local_98 != (LOGGER_LOG)0x0) {
          (*local_98)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
                      ,"STRING_sprintf",0x272,1,"Failure unable to reallocate memory. size=%zu",l_2)
          ;
        }
        maxBufSize._4_4_ = 0x273;
      }
      else {
        *(size_t *)temp = s1Length;
        arg_list[0].overflow_arg_area = local_148;
        arg_list[0]._0_8_ = &stack0x00000008;
        s2Length = 0x30;
        local_58 = 0x10;
        iVar1 = vsnprintf((char *)(*(long *)temp + realloc_size),(size_t)l_2,format,&local_58);
        if (iVar1 < 0) {
          l_3 = xlogging_get_log_function();
          if (l_3 != (LOGGER_LOG)0x0) {
            (*l_3)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
                   ,"STRING_sprintf",0x264,1,"Failure vsnprintf formatting error");
          }
          *(undefined1 *)(*(long *)temp + realloc_size) = 0;
          maxBufSize._4_4_ = 0x266;
        }
        else {
          maxBufSize._4_4_ = 0;
        }
      }
    }
  }
  return maxBufSize._4_4_;
}

Assistant:

__attribute__((format(printf, 2, 3)))
#endif
int STRING_sprintf(STRING_HANDLE handle, const char* format, ...)
{
    int result;

#ifdef STRINGS_C_SPRINTF_BUFFER_SIZE
    size_t maxBufSize = STRINGS_C_SPRINTF_BUFFER_SIZE;
    char buf[STRINGS_C_SPRINTF_BUFFER_SIZE];
#else
    size_t maxBufSize = 0;
    char* buf = NULL;
#endif

    if (handle == NULL || format == NULL)
    {
        /* Codes_SRS_STRING_07_042: [if the parameters s1 or format are NULL then STRING_sprintf shall return non zero value.] */
        LogError("Invalid arg (NULL)");
        result = MU_FAILURE;
    }
    else
    {
        va_list arg_list;
        int s2Length;
        va_start(arg_list, format);

        s2Length = vsnprintf(buf, maxBufSize, format, arg_list);
        va_end(arg_list);
        if (s2Length < 0)
        {
            /* Codes_SRS_STRING_07_043: [If any error is encountered STRING_sprintf shall return a non zero value.] */
            LogError("Failure vsnprintf return < 0");
            result = MU_FAILURE;
        }
        else if (s2Length == 0)
        {
            // Don't need to reallocate and nothing should be added
            result = 0;
        }
        else
        {
            STRING* s1 = (STRING*)handle;
            char* temp;
            size_t s1Length = strlen(s1->s);
            size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, s2Length), 1);
            if (realloc_size != SIZE_MAX &&
                (temp = (char*)realloc(s1->s, realloc_size)) != NULL)
            {
                s1->s = temp;
                va_start(arg_list, format);
                if (vsnprintf(s1->s + s1Length, realloc_size, format, arg_list) < 0)
                {
                    /* Codes_SRS_STRING_07_043: [If any error is encountered STRING_sprintf shall return a non zero value.] */
                    LogError("Failure vsnprintf formatting error");
                    s1->s[s1Length] = '\0';
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_STRING_07_044: [On success STRING_sprintf shall return 0.]*/
                    result = 0;
                }
                va_end(arg_list);
            }
            else
            {
                /* Codes_SRS_STRING_07_043: [If any error is encountered STRING_sprintf shall return a non zero value.] */
                LogError("Failure unable to reallocate memory. size=%zu", realloc_size);
                result = MU_FAILURE;
            }
        }
    }
    return result;
}